

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3_both.cc
# Opt level: O3

bool bssl::tls_add_message(SSL *ssl,Array<unsigned_char> *msg)

{
  SSL3_STATE *pSVar1;
  SSL_HANDSHAKE *pSVar2;
  Span<const_unsigned_char> in;
  bool bVar3;
  int iVar4;
  uchar *puVar5;
  BUF_MEM *__p;
  size_t sVar6;
  uchar *puVar7;
  buf_mem_st *buf;
  size_t in_R8;
  size_t in_R9;
  UniquePtr<BUF_MEM> *this;
  uchar *len;
  uchar *in_00;
  Span<const_unsigned_char> in_01;
  Span<const_unsigned_char> in_02;
  
  in_00 = msg->data_;
  puVar7 = (uchar *)msg->size_;
  iVar4 = SSL_is_quic(ssl);
  if ((iVar4 == 0) &&
     (((ssl->s3->aead_write_ctx)._M_t.
       super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl)->cipher_ ==
      (SSL_CIPHER *)0x0)) {
    while (puVar7 != (uchar *)0x0) {
      puVar5 = (uchar *)(ulong)ssl->max_send_fragment;
      if (puVar7 < (uchar *)(ulong)ssl->max_send_fragment) {
        puVar5 = puVar7;
      }
      puVar7 = puVar7 + -(long)puVar5;
      in_01.size_ = in_R8;
      in_01.data_ = puVar5;
      bVar3 = add_record_to_flight((bssl *)ssl,(SSL *)0x16,(uint8_t)in_00,in_01);
      in_00 = in_00 + (long)puVar5;
      if (!bVar3) {
        return false;
      }
    }
  }
  else {
    while (puVar7 != (uchar *)0x0) {
      pSVar1 = ssl->s3;
      buf = (pSVar1->pending_hs_data)._M_t.
            super___uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_buf_mem_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_buf_mem_st_*,_false>._M_head_impl;
      puVar5 = (uchar *)(ulong)ssl->max_send_fragment;
      if (buf == (buf_mem_st *)0x0) {
        if (puVar5 == (uchar *)0x0) goto LAB_00148aba;
        len = puVar7;
        if (puVar5 <= puVar7) {
          len = puVar5;
        }
        this = &pSVar1->pending_hs_data;
        puVar5 = in_00 + (long)len;
        puVar7 = puVar7 + -(long)len;
LAB_001489ee:
        __p = BUF_MEM_new();
        std::__uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter>::reset
                  ((__uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter> *)this,(pointer)__p);
        buf = (ssl->s3->pending_hs_data)._M_t.
              super___uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_buf_mem_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_buf_mem_st_*,_false>._M_head_impl;
      }
      else {
        if ((uchar *)buf->length < puVar5) {
          this = &pSVar1->pending_hs_data;
LAB_001489c9:
          sVar6 = buf->length;
          bVar3 = false;
        }
        else {
          bVar3 = tls_flush_pending_hs_data(ssl);
          if (!bVar3) {
            return false;
          }
          buf = (ssl->s3->pending_hs_data)._M_t.
                super___uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_buf_mem_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_buf_mem_st_*,_false>._M_head_impl;
          this = &ssl->s3->pending_hs_data;
          if (buf != (buf_mem_st *)0x0) goto LAB_001489c9;
          bVar3 = true;
          buf = (buf_mem_st *)0x0;
          sVar6 = 0;
        }
        len = (uchar *)(ssl->max_send_fragment - sVar6);
        if (len == (uchar *)0x0) {
LAB_00148aba:
          __assert_fail("!chunk.empty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/s3_both.cc"
                        ,0x7a,"bool bssl::tls_add_message(SSL *, Array<uint8_t>)");
        }
        if (puVar7 < len) {
          len = puVar7;
        }
        puVar5 = in_00 + (long)len;
        puVar7 = puVar7 + -(long)len;
        if (bVar3) goto LAB_001489ee;
      }
      if (buf == (BUF_MEM *)0x0) {
        return false;
      }
      iVar4 = BUF_MEM_append(buf,in_00,(size_t)len);
      in_00 = puVar5;
      if (iVar4 == 0) {
        return false;
      }
    }
  }
  in_02.size_ = in_R9;
  in_02.data_ = (uchar *)msg->size_;
  ssl_do_msg_callback((bssl *)ssl,(SSL *)0x1,0x16,(int)msg->data_,in_02);
  pSVar2 = (ssl->s3->hs)._M_t.super___uniq_ptr_impl<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>.
           _M_t.super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false>._M_head_impl;
  if ((pSVar2 != (SSL_HANDSHAKE *)0x0) &&
     (in.data_ = msg->data_, in.size_ = msg->size_,
     bVar3 = SSLTranscript::Update(&pSVar2->transcript,in), !bVar3)) {
    return false;
  }
  return true;
}

Assistant:

bool tls_add_message(SSL *ssl, Array<uint8_t> msg) {
  // Pack handshake data into the minimal number of records. This avoids
  // unnecessary encryption overhead, notably in TLS 1.3 where we send several
  // encrypted messages in a row. For now, we do not do this for the null
  // cipher. The benefit is smaller and there is a risk of breaking buggy
  // implementations.
  //
  // TODO(crbug.com/374991962): See if we can do this uniformly.
  Span<const uint8_t> rest = msg;
  if (!SSL_is_quic(ssl) && ssl->s3->aead_write_ctx->is_null_cipher()) {
    while (!rest.empty()) {
      Span<const uint8_t> chunk = rest.subspan(0, ssl->max_send_fragment);
      rest = rest.subspan(chunk.size());

      if (!add_record_to_flight(ssl, SSL3_RT_HANDSHAKE, chunk)) {
        return false;
      }
    }
  } else {
    while (!rest.empty()) {
      // Flush if |pending_hs_data| is full.
      if (ssl->s3->pending_hs_data &&
          ssl->s3->pending_hs_data->length >= ssl->max_send_fragment &&
          !tls_flush_pending_hs_data(ssl)) {
        return false;
      }

      size_t pending_len =
          ssl->s3->pending_hs_data ? ssl->s3->pending_hs_data->length : 0;
      Span<const uint8_t> chunk =
          rest.subspan(0, ssl->max_send_fragment - pending_len);
      assert(!chunk.empty());
      rest = rest.subspan(chunk.size());

      if (!ssl->s3->pending_hs_data) {
        ssl->s3->pending_hs_data.reset(BUF_MEM_new());
      }
      if (!ssl->s3->pending_hs_data ||
          !BUF_MEM_append(ssl->s3->pending_hs_data.get(), chunk.data(),
                          chunk.size())) {
        return false;
      }
    }
  }

  ssl_do_msg_callback(ssl, 1 /* write */, SSL3_RT_HANDSHAKE, msg);
  // TODO(svaldez): Move this up a layer to fix abstraction for SSLTranscript on
  // hs.
  if (ssl->s3->hs != NULL &&  //
      !ssl->s3->hs->transcript.Update(msg)) {
    return false;
  }
  return true;
}